

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O3

void Sfm_LibPrintGate(Mio_Cell2_t *pCell,char *pFanins,Mio_Cell2_t *pCell2,char *pFanins2)

{
  ulong uVar1;
  
  printf(" %-20s(",pCell->pName);
  if (0xfffffff < *(uint *)&pCell->field_0x10) {
    uVar1 = 0;
    do {
      if (pFanins[uVar1] == 0x10) {
        Sfm_LibPrintGate(pCell2,pFanins2,(Mio_Cell2_t *)0x0,(char *)0x0);
      }
      else {
        printf(" %c",(ulong)((int)pFanins[uVar1] + 0x61));
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < *(uint *)&pCell->field_0x10 >> 0x1c);
  }
  printf(" )");
  return;
}

Assistant:

void Sfm_LibPrintGate( Mio_Cell2_t * pCell, char * pFanins, Mio_Cell2_t * pCell2, char * pFanins2 )
{
    int k;
    printf( " %-20s(", pCell->pName );
    for ( k = 0; k < (int)pCell->nFanins; k++ )
        if ( pFanins[k] == (char)16 )
            Sfm_LibPrintGate( pCell2, pFanins2, NULL, NULL );
        else
            printf( " %c", 'a' + pFanins[k] );
    printf( " )" );
}